

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int POOL_tryAdd(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  int iVar1;
  void *in_RDX;
  POOL_function in_RSI;
  POOL_ctx *in_RDI;
  uint local_4;
  
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->queueMutex);
  iVar1 = isQueueFull(in_RDI);
  if (iVar1 == 0) {
    POOL_add_internal(in_RDI,in_RSI,in_RDX);
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->queueMutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->queueMutex);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

int POOL_tryAdd(POOL_ctx* ctx, POOL_function function, void* opaque)
{
    assert(ctx != NULL);
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    if (isQueueFull(ctx)) {
        ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        return 0;
    }
    POOL_add_internal(ctx, function, opaque);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return 1;
}